

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall kj::str<bool_const&>(String *__return_storage_ptr__,kj *this,bool *params)

{
  ArrayPtr<const_char> local_18;
  
  local_18 = (ArrayPtr<const_char>)toCharSequence<bool_const&>((bool *)this);
  _::concat<kj::StringPtr>(__return_storage_ptr__,(_ *)&local_18,(StringPtr *)local_18.size_);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}